

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadresource.cpp
# Opt level: O3

load_gameboard_status_t *
Game::Loader::load_GameBoard_data_from_file
          (load_gameboard_status_t *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  _Tuple_impl<0UL,_bool,_Game::GameBoard> *p_Var2;
  char *__nptr;
  char cVar3;
  int iVar4;
  difference_type dVar5;
  istream *piVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  ostream *poVar10;
  undefined8 uVar11;
  uint uVar12;
  pointer pbVar13;
  ull uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  string tempLine;
  vector<Game::tile_t,_std::allocator<Game::tile_t>_> processed_tile_data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_tile_data;
  ifstream stateFile_1;
  ifstream stateFile;
  int local_54c;
  value_type local_548;
  char *local_528;
  undefined8 local_520;
  char local_518;
  undefined7 uStack_517;
  vector<Game::tile_t,_std::allocator<Game::tile_t>_> local_508;
  char *local_4f0;
  load_gameboard_status_t *local_4e8;
  pointer local_4e0;
  ull local_4d8;
  pointer local_4d0;
  vector<Game::tile_t,_std::allocator<Game::tile_t>_> local_4c8;
  tile_t local_4b0;
  long *local_4a0 [2];
  long local_490 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_480;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  GameBoard local_448;
  ios_base local_3d0 [112];
  undefined8 auStack_360 [37];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    pcVar1 = (filename->_M_dataplus)._M_p;
    local_4e8 = __return_storage_ptr__;
    local_4a0[0] = local_490;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_4a0,pcVar1,pcVar1 + filename->_M_string_length);
    std::ifstream::ifstream(&local_448,(string *)local_4a0,_S_in);
    local_528 = (char *)CONCAT71(local_528._1_7_,10);
    __first._8_8_ = 0xffffffff;
    __first._M_sbuf =
         *(streambuf_type **)
          ((long)auStack_360 +
          *(long *)&local_448.gbda.
                    super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
                    .
                    super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
                    .
                    super__Head_base<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>,_false>
                    ._M_head_impl.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                    _M_impl.super__Vector_impl_data._M_start[-2].blocked);
    dVar5 = std::
            __count_if<std::istreambuf_iterator<char,std::char_traits<char>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (__first,(istreambuf_iterator<char,_std::char_traits<char>_>)
                               (ZEXT816(0xffffffff) << 0x40),
                       (_Iter_equals_val<const_char>)&local_528);
    std::ifstream::~ifstream(&local_448);
    if (local_4a0[0] != local_490) {
      operator_delete(local_4a0[0],local_490[0] + 1);
    }
    local_4d8 = (ull)(int)dVar5;
    local_468.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_468.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar17 = 0;
    local_468.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_528 = &local_518;
    local_520 = 0;
    local_518 = '\0';
    while( true ) {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_528,cVar3);
      if ((((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) || (9 < uVar17))
      break;
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&local_448,(string *)&local_528,_S_in);
      local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
      local_548._M_string_length = 0;
      local_548.field_2._M_local_buf[0] = '\0';
      for (uVar12 = 0;
          (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&local_448,(string *)&local_548,','),
          ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0 && (uVar12 < 10));
          uVar12 = uVar12 + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_468,&local_548);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != &local_548.field_2) {
        operator_delete(local_548._M_dataplus._M_p,
                        CONCAT71(local_548.field_2._M_allocated_capacity._1_7_,
                                 local_548.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&local_448);
      std::ios_base::~ios_base(local_3d0);
      uVar17 = uVar17 + 1;
    }
    if (local_528 != &local_518) {
      operator_delete(local_528,CONCAT71(uStack_517,local_518) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_480,&local_468);
    local_508.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_508.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (tile_t *)0x0;
    local_508.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (tile_t *)0x0;
    local_4d0 = local_480.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_480.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_480.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_54c = 0;
      pbVar13 = local_480.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
        pcVar1 = (pbVar13->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_548,pcVar1,pcVar1 + pbVar13->_M_string_length);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&local_448,(string *)&local_548,_S_in);
        local_528 = &local_518;
        local_520 = 0;
        local_518 = '\0';
        lVar9 = 0;
        lVar8 = 0;
        iVar15 = 0;
        local_4e0 = pbVar13;
        while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)&local_448,(string *)&local_528,':'),
              __nptr = local_528, ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0
              ) {
          if (iVar15 == 1) {
            piVar7 = __errno_location();
            iVar16 = *piVar7;
            *piVar7 = 0;
            lVar9 = strtol(__nptr,&local_4f0,10);
            if (local_4f0 == __nptr) {
              std::__throw_invalid_argument("stoi");
LAB_0010bb44:
              std::__throw_out_of_range("stoi");
              goto LAB_0010bb50;
            }
            if ((lVar9 - 0x80000000U < 0xffffffff00000000) || (iVar4 = *piVar7, iVar4 == 0x22))
            goto LAB_0010bb5c;
LAB_0010b8ff:
            if (iVar4 == 0) {
              *piVar7 = iVar16;
            }
          }
          else {
            if (iVar15 == 0) {
              piVar7 = __errno_location();
              iVar16 = *piVar7;
              *piVar7 = 0;
              lVar8 = strtol(__nptr,&local_4f0,10);
              if (local_4f0 != __nptr) {
                if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (iVar4 = *piVar7, iVar4 != 0x22))
                goto LAB_0010b8ff;
                goto LAB_0010bb44;
              }
LAB_0010bb50:
              std::__throw_invalid_argument("stoi");
LAB_0010bb5c:
              uVar11 = std::__throw_out_of_range("stoi");
              if (local_4c8.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_4c8.
                                super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_4c8.
                                      super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_4c8.
                                      super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_508.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_508.
                                super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_508.
                                      super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_508.
                                      super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_468);
              std::ifstream::~ifstream(local_238);
              _Unwind_Resume(uVar11);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"ERROR: [tile_processed_counter: ",0x20);
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_54c);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"]: Read past MAX_NO_TILE_IDXS! (idx no:",0x27);
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,")\n",2);
          }
          iVar15 = iVar15 + 1;
        }
        if (local_528 != &local_518) {
          operator_delete(local_528,CONCAT71(uStack_517,local_518) + 1);
        }
        uVar14 = (ull)(int)lVar8;
        std::__cxx11::istringstream::~istringstream((istringstream *)&local_448);
        std::ios_base::~ios_base(local_3d0);
        local_4b0.blocked = (int)lVar9 != 0;
        local_4b0.value = uVar14;
        if (local_508.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_508.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::_M_realloc_insert<Game::tile_t>
                    (&local_508,
                     (iterator)
                     local_508.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_4b0);
        }
        else {
          (local_508.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
           super__Vector_impl_data._M_finish)->value = uVar14;
          *(ulong *)&(local_508.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->blocked =
               CONCAT71(local_4b0._9_7_,local_4b0.blocked);
          local_508.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_508.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        pbVar13 = local_4e0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,
                          CONCAT71(local_548.field_2._M_allocated_capacity._1_7_,
                                   local_548.field_2._M_local_buf[0]) + 1);
        }
        local_54c = local_54c + 1;
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 != local_4d0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_480);
    std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector(&local_4c8,&local_508);
    GameBoard::GameBoard(&local_448,local_4d8,&local_4c8);
    *(pointer *)
     &(local_4e8->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
      super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
      _M_head_impl.gbda.
      super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
      .super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_> =
         local_448.gbda.
         super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
         .super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>.
         super__Head_base<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>,_false>.
         _M_head_impl.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(local_4e8->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
             super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
             _M_head_impl.gbda.
             super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
             .super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_> + 8)
         = local_448.gbda.
           super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
           .super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>.
           super__Head_base<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>,_false>.
           _M_head_impl.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(local_4e8->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
             super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
             _M_head_impl.gbda.
             super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
             .super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_> +
     0x10) = local_448.gbda.
             super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
             .super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>.
             super__Head_base<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>,_false>.
             _M_head_impl.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    local_448.gbda.
    super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
    .super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>.
    super__Head_base<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>,_false>.
    _M_head_impl.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_448.gbda.
    super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
    .super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>.
    super__Head_base<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>,_false>.
    _M_head_impl.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_448.gbda.
    super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
    .super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>.
    super__Head_base<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>,_false>.
    _M_head_impl.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_4e8->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
    super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
    _M_head_impl.gbda.
    super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         local_448.gbda.
         super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
         .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    (local_4e8->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
    super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
    _M_head_impl.largestTile = local_448.largestTile;
    (local_4e8->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
    super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
    _M_head_impl.moveCount = local_448.moveCount;
    p_Var2 = &local_4e8->super__Tuple_impl<0UL,_bool,_Game::GameBoard>;
    (p_Var2->super__Tuple_impl<1UL,_Game::GameBoard>).super__Head_base<1UL,_Game::GameBoard,_false>.
    _M_head_impl.win = local_448.win;
    (p_Var2->super__Tuple_impl<1UL,_Game::GameBoard>).super__Head_base<1UL,_Game::GameBoard,_false>.
    _M_head_impl.moved = local_448.moved;
    *(undefined6 *)
     &(p_Var2->super__Tuple_impl<1UL,_Game::GameBoard>).
      super__Head_base<1UL,_Game::GameBoard,_false>._M_head_impl.field_0x22 = local_448._34_6_;
    (local_4e8->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
    super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
    _M_head_impl.score = local_448.score;
    (local_4e8->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).super__Head_base<0UL,_bool,_false>.
    _M_head_impl = true;
    if (local_4c8.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4c8.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_4c8.
                            super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_4c8.
                            super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_508.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_508.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_508.
                            super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_508.
                            super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_468);
    __return_storage_ptr__ = local_4e8;
  }
  else {
    *(undefined2 *)
     &(__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
      super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
      _M_head_impl.field_0x26 = 0;
    *(undefined4 *)
     &(__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
      super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
      _M_head_impl.field_0x22 = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
      super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
      _M_head_impl.gbda.
      super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
      .super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_> = 0;
    *(pointer *)
     ((long)&(__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
             super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
             _M_head_impl.gbda.
             super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
             .super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_> + 8)
         = (pointer)0x0;
    *(pointer *)
     ((long)&(__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
             super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
             _M_head_impl.gbda.
             super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
             .super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_> +
     0x10) = (pointer)0x0;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
    super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
    _M_head_impl.gbda.
    super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
    super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
    _M_head_impl.win = false;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
    super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
    _M_head_impl.moved = true;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
    super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
    _M_head_impl.score = 0;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
    super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
    _M_head_impl.largestTile = 2;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
    super__Tuple_impl<1UL,_Game::GameBoard>.super__Head_base<1UL,_Game::GameBoard,_false>.
    _M_head_impl.moveCount = -1;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Game::GameBoard>).
    super__Head_base<0UL,_bool,_false>._M_head_impl = false;
  }
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

load_gameboard_status_t load_GameBoard_data_from_file(std::string filename) {
  std::ifstream stateFile(filename);
  if (stateFile) {
    const ull savedBoardPlaySize = GetLines(filename);
    const auto file_tile_data = get_file_tile_data(stateFile);
    const auto processed_tile_data =
        process_file_tile_string_data(file_tile_data);
    return std::make_tuple(true,
                           GameBoard(savedBoardPlaySize, processed_tile_data));
  }
  return std::make_tuple(false, GameBoard{});
}